

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryReporterPlugin.cpp
# Opt level: O0

MemoryReportFormatter * __thiscall
MemoryReporterPlugin::createMemoryFormatter(MemoryReporterPlugin *this,SimpleString *type)

{
  SimpleString *left;
  bool bVar1;
  MemoryReporterPlugin *pMVar2;
  TestMemoryAllocator *internalAllocator;
  SimpleString local_50 [2];
  SimpleString local_30;
  SimpleString *local_20;
  SimpleString *type_local;
  MemoryReporterPlugin *this_local;
  
  local_20 = type;
  type_local = (SimpleString *)this;
  SimpleString::SimpleString(&local_30,"normal");
  bVar1 = operator==(type,&local_30);
  SimpleString::~SimpleString(&local_30);
  left = local_20;
  if (bVar1) {
    pMVar2 = (MemoryReporterPlugin *)
             operator_new(8,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTestExt/MemoryReporterPlugin.cpp"
                          ,0x3c);
    NormalMemoryReportFormatter::NormalMemoryReportFormatter((NormalMemoryReportFormatter *)pMVar2);
    this_local = pMVar2;
  }
  else {
    SimpleString::SimpleString(local_50,"code");
    bVar1 = operator==(left,local_50);
    SimpleString::~SimpleString(local_50);
    if (bVar1) {
      pMVar2 = (MemoryReporterPlugin *)
               operator_new(0x18,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTestExt/MemoryReporterPlugin.cpp"
                            ,0x3f);
      internalAllocator = defaultMallocAllocator();
      CodeMemoryReportFormatter::CodeMemoryReportFormatter
                ((CodeMemoryReportFormatter *)pMVar2,internalAllocator);
      this_local = pMVar2;
    }
    else {
      this_local = (MemoryReporterPlugin *)0x0;
    }
  }
  return (MemoryReportFormatter *)this_local;
}

Assistant:

MemoryReportFormatter* MemoryReporterPlugin::createMemoryFormatter(const SimpleString& type)
{
    if (type == "normal") {
        return  new NormalMemoryReportFormatter;
    }
    else if (type == "code") {
        return new CodeMemoryReportFormatter(defaultMallocAllocator());
    }
    return NULLPTR;
}